

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_subexp_decode(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  byte bVar1;
  cram_external_type cVar2;
  uchar *puVar3;
  uint uVar4;
  uint uVar5;
  cram_external_type cVar6;
  ulong uVar7;
  ulong uVar8;
  cram_external_type cVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  bool bVar13;
  
  uVar8 = 0;
  uVar7 = (ulong)(uint)*out_size;
  if (*out_size < 1) {
    uVar7 = uVar8;
  }
  cVar2 = (c->field_6).external.type;
  for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    puVar3 = in->data;
    sVar12 = in->byte;
    cVar6 = E_LONG;
    uVar5 = in->bit;
    do {
      bVar1 = puVar3[sVar12];
      uVar11 = uVar5 - 1;
      in->bit = uVar11;
      if (uVar5 == 0) {
        in->bit = 7;
        sVar12 = sVar12 + 1;
        in->byte = sVar12;
        uVar11 = 7;
      }
      cVar6 = cVar6 - E_INT;
      uVar4 = uVar5 & 0x1f;
      uVar5 = uVar11;
    } while ((bVar1 >> uVar4 & 1) != 0);
    if (cVar6 == E_INT) {
      iVar10 = 0;
      cVar6 = cVar2;
      while (bVar13 = cVar6 != 0, cVar6 = cVar6 - E_INT, bVar13) {
        iVar10 = (uint)((puVar3[sVar12] >> (uVar11 & 0x1f) & 1) != 0) + iVar10 * 2;
        sVar12 = sVar12 + ((int)uVar11 < 1);
        in->byte = sVar12;
        uVar11 = uVar11 - 1 & 7;
        in->bit = uVar11;
      }
    }
    else {
      iVar10 = 0;
      for (cVar9 = cVar2; cVar6 != cVar9; cVar9 = cVar9 - E_INT) {
        iVar10 = (uint)((puVar3[sVar12] >> (uVar11 & 0x1f) & 1) != 0) + iVar10 * 2;
        sVar12 = sVar12 + ((int)uVar11 < 1);
        in->byte = sVar12;
        uVar11 = uVar11 - 1 & 7;
        in->bit = uVar11;
      }
      iVar10 = iVar10 + (1 << ((char)cVar2 - (char)cVar6 & 0x1fU));
    }
    *(int *)(out + uVar8 * 4) = iVar10 - (c->field_6).huffman.ncodes;
  }
  return 0;
}

Assistant:

int cram_subexp_decode(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int n, count;
    int k = c->subexp.k;

    for (count = 0, n = *out_size; count < n; count++) {
	int i = 0, tail;
	int val;

	/* Get number of 1s */
	//while (get_bit_MSB(in) == 1) i++;
	i = get_one_bits_MSB(in);

	/*
	 * Val is
	 * i > 0:  2^(k+i-1) + k+i-1 bits
	 * i = 0:  k bits
	 */
	if (i) {
	    tail = i + k-1;
	    val = 0;
	    while (tail) {
		//val = val<<1; val |= get_bit_MSB(in);
		GET_BIT_MSB(in, val);
		tail--;
	    }
	    val += 1 << (i + k-1);
	} else {
	    tail = k;
	    val = 0;
	    while (tail) {
		//val = val<<1; val |= get_bit_MSB(in);
		GET_BIT_MSB(in, val);
		tail--;
	    }
	}

	out_i[count] = val - c->subexp.offset;
    }

    return 0;
}